

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ShaderSourceCase::test(ShaderSourceCase *this)

{
  CallLogWrapper *gl;
  int *piVar1;
  ostringstream *poVar2;
  GLuint shader;
  char *description;
  TestContext *pTVar3;
  int iVar4;
  allocator<char> local_9b5;
  StateQueryMemoryWriteGuard<int> sourceLength_1;
  StateQueryMemoryWriteGuard<int> sourceLength;
  char buffer [2048];
  
  gl = &(this->super_ApiCase).super_CallLogWrapper;
  requireShaderCompiler
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl);
  shader = glu::CallLogWrapper::glCreateShader(gl,0x8b31);
  verifyShaderParam((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl,
                    shader,0x8b88,0);
  glu::CallLogWrapper::glShaderSource
            (gl,shader,1,&Functional::(anonymous_namespace)::brokenShader,(GLint *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&sourceLength);
  glu::CallLogWrapper::glGetShaderiv(gl,shader,0x8b88,&sourceLength.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&sourceLength,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,Functional::(anonymous_namespace)::brokenShader,
             (allocator<char> *)&sourceLength_1);
  iVar4 = buffer._8_4_ + 1;
  std::__cxx11::string::~string((string *)buffer);
  if (sourceLength.m_value != iVar4) {
    buffer._0_8_ = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                   m_log;
    poVar2 = (ostringstream *)(buffer + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"// ERROR: Expected length ");
    std::ostream::operator<<(poVar2,iVar4);
    std::operator<<((ostream *)poVar2,"; got ");
    std::ostream::operator<<(poVar2,sourceLength.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  sourceLength._0_8_ = Functional::(anonymous_namespace)::brokenShader;
  stack0xfffffffffffff660 = (_func_int **)Functional::(anonymous_namespace)::brokenShader;
  glu::CallLogWrapper::glShaderSource(gl,shader,2,(GLchar **)&sourceLength,(GLint *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
            (&sourceLength_1);
  glu::CallLogWrapper::glGetShaderiv(gl,shader,0x8b88,&sourceLength_1.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
            (&sourceLength_1,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)buffer,Functional::(anonymous_namespace)::brokenShader,&local_9b5);
  iVar4 = buffer._8_4_ * 2 + 1;
  std::__cxx11::string::~string((string *)buffer);
  if (sourceLength_1.m_value != iVar4) {
    buffer._0_8_ = ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
                   m_log;
    poVar2 = (ostringstream *)(buffer + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"// ERROR: Expected length ");
    std::ostream::operator<<(poVar2,iVar4);
    std::operator<<((ostream *)poVar2,"; got ");
    std::ostream::operator<<(poVar2,sourceLength_1.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  memset(buffer,0,0x800);
  buffer[0] = 'x';
  sourceLength_1.m_preguard = 0;
  glu::CallLogWrapper::glGetShaderSource(gl,shader,0x800,&sourceLength_1.m_preguard,buffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sourceLength,Functional::(anonymous_namespace)::brokenShader,&local_9b5);
  iVar4 = sourceLength.m_postguard * 2;
  std::__cxx11::string::~string((string *)&sourceLength);
  if (sourceLength_1.m_preguard == iVar4) {
    if (buffer[iVar4] == '\0') goto LAB_00ef5766;
    sourceLength._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    piVar1 = &sourceLength.m_postguard;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar1);
    std::operator<<((ostream *)piVar1,"// ERROR: Expected null terminator at ");
    std::ostream::operator<<(piVar1,iVar4);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&sourceLength,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar1);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar3->m_testResult != QP_TEST_RESULT_PASS) goto LAB_00ef5766;
    description = "did not get a null terminator";
  }
  else {
    sourceLength._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    piVar1 = &sourceLength.m_postguard;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar1);
    std::operator<<((ostream *)piVar1,"// ERROR: Expected write length ");
    std::ostream::operator<<(piVar1,iVar4);
    std::operator<<((ostream *)piVar1,"; got ");
    std::ostream::operator<<(piVar1,sourceLength_1.m_preguard);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&sourceLength,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar1);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar3->m_testResult != QP_TEST_RESULT_PASS) goto LAB_00ef5766;
    description = "got invalid source length";
  }
  tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,description);
LAB_00ef5766:
  memset(buffer,0,0x800);
  buffer[0] = 'x';
  sourceLength_1.m_preguard = 0;
  glu::CallLogWrapper::glGetShaderSource(gl,shader,1,&sourceLength_1.m_preguard,buffer);
  if (sourceLength_1.m_preguard != 0) {
    sourceLength._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    piVar1 = &sourceLength.m_postguard;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar1);
    std::operator<<((ostream *)piVar1,"// ERROR: Expected write length 0; got ");
    std::ostream::operator<<(piVar1,sourceLength_1.m_preguard);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&sourceLength,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar1);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid source length");
    }
  }
  if (buffer[0] != '\0') {
    sourceLength._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    piVar1 = &sourceLength.m_postguard;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)piVar1);
    std::operator<<((ostream *)piVar1,"// ERROR: Expected null terminator; got=");
    std::ostream::operator<<(piVar1,(int)buffer[0]);
    std::operator<<((ostream *)piVar1,", char=");
    std::operator<<((ostream *)piVar1,buffer[0]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&sourceLength,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)piVar1);
    pTVar3 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (pTVar3->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"got invalid terminator");
    }
  }
  glu::CallLogWrapper::glDeleteShader(gl,shader);
  ApiCase::expectError(&this->super_ApiCase,0);
  return;
}

Assistant:

void test (void)
	{
		requireShaderCompiler(m_testCtx, *this);

		using tcu::TestLog;

		// SHADER_SOURCE_LENGTH does include 0-terminator
		const GLuint shader = glCreateShader(GL_VERTEX_SHADER);
		verifyShaderParam(m_testCtx, *this, shader, GL_SHADER_SOURCE_LENGTH, 0);

		// check the SHADER_SOURCE_LENGTH
		{
			glShaderSource(shader, 1, &brokenShader, DE_NULL);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> sourceLength;
			glGetShaderiv(shader, GL_SHADER_SOURCE_LENGTH, &sourceLength);

			sourceLength.verifyValidity(m_testCtx);

			const GLint referenceLength = (GLint)std::string(brokenShader).length() + 1; // including the null terminator
			if (sourceLength != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << referenceLength	<< "; got " << sourceLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
		}

		// check the concat source SHADER_SOURCE_LENGTH
		{
			const char* shaders[] = {brokenShader, brokenShader};
			glShaderSource(shader, 2, shaders, DE_NULL);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> sourceLength;
			glGetShaderiv(shader, GL_SHADER_SOURCE_LENGTH, &sourceLength);

			sourceLength.verifyValidity(m_testCtx);

			const GLint referenceLength = 2 * (GLint)std::string(brokenShader).length() + 1; // including the null terminator
			if (sourceLength != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected length " << referenceLength << "; got " << sourceLength << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
		}

		// check the string length
		{
			char buffer[2048] = {'x'};
			DE_ASSERT(DE_LENGTH_OF_ARRAY(buffer) > 2 * (int)std::string(brokenShader).length());

			GLint written = 0; // not inluding null-terminator
			glGetShaderSource(shader, DE_LENGTH_OF_ARRAY(buffer), &written, buffer);

			const GLint referenceLength = 2 * (GLint)std::string(brokenShader).length();
			if (written != referenceLength)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length " << referenceLength << "; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
			// check null pointer at
			else
			{
				if (buffer[referenceLength] != '\0')
				{
					m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator at " << referenceLength << TestLog::EndMessage;
					if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
						m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "did not get a null terminator");
				}
			}
		}

		// check with small buffer
		{
			char buffer[2048] = {'x'};

			GLint written = 0;
			glGetShaderSource(shader, 1, &written, buffer);

			if (written != 0)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected write length 0; got " << written << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid source length");
			}
			if (buffer[0] != '\0')
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected null terminator; got=" << int(buffer[0]) << ", char=" << buffer[0] << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid terminator");
			}
		}

		glDeleteShader(shader);
		expectError(GL_NO_ERROR);
	}